

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_base_active_by_fd(event_base *base,int fd,short events)

{
  ulong uVar1;
  event *peVar2;
  long lVar3;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if ((events & 1U) == 0) {
    evmap_io_active_(base,fd,events & 0x86);
  }
  else {
    if ((base->timeheap).n != 0) {
      uVar1 = 0;
      do {
        peVar2 = (base->timeheap).p[uVar1];
        if (peVar2->ev_fd == fd) {
          event_active_nolock_(peVar2,1,1);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < (base->timeheap).n);
    }
    if (0 < base->n_common_timeouts) {
      lVar3 = 0;
      do {
        for (peVar2 = (base->common_timeout_queues[lVar3]->events).tqh_first; peVar2 != (event *)0x0
            ; peVar2 = (peVar2->ev_timeout_pos).ev_next_with_common_timeout.tqe_next) {
          if (peVar2->ev_fd == fd) {
            event_active_nolock_(peVar2,1,1);
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < base->n_common_timeouts);
    }
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    return;
  }
  return;
}

Assistant:

void
event_base_active_by_fd(struct event_base *base, evutil_socket_t fd, short events)
{
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	/* Activate any non timer events */
	if (!(events & EV_TIMEOUT)) {
		evmap_io_active_(base, fd, events & (EV_READ|EV_WRITE|EV_CLOSED));
	} else {
		/* If we want to activate timer events, loop and activate each event with
		 * the same fd in both the timeheap and common timeouts list */
		int i;
		unsigned u;
		struct event *ev;

		for (u = 0; u < base->timeheap.n; ++u) {
			ev = base->timeheap.p[u];
			if (ev->ev_fd == fd) {
				event_active_nolock_(ev, EV_TIMEOUT, 1);
			}
		}

		for (i = 0; i < base->n_common_timeouts; ++i) {
			struct common_timeout_list *ctl = base->common_timeout_queues[i];
			TAILQ_FOREACH(ev, &ctl->events,
				ev_timeout_pos.ev_next_with_common_timeout) {
				if (ev->ev_fd == fd) {
					event_active_nolock_(ev, EV_TIMEOUT, 1);
				}
			}
		}
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);
}